

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O3

void __thiscall TTD::FileReader::~FileReader(FileReader *this)

{
  this->_vptr_FileReader = (_func_int **)&PTR__FileReader_014e62e0;
  if (this->m_hfile != (JsTTDStreamHandle)0x0) {
    (*this->m_pfClose)(this->m_hfile,true,false);
    this->m_hfile = (JsTTDStreamHandle)0x0;
  }
  if (this->m_buffer != (byte *)0x0) {
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,this->m_buffer,0x200000);
    this->m_buffer = (byte *)0x0;
  }
  return;
}

Assistant:

FileReader::~FileReader()
    {
        if(this->m_hfile != nullptr)
        {
            this->m_pfClose(this->m_hfile, true, false);
            this->m_hfile = nullptr;
        }

        if(this->m_buffer != nullptr)
        {
            TT_HEAP_FREE_ARRAY(byte, this->m_buffer, TTD_SERIALIZATION_BUFFER_SIZE);
            this->m_buffer = nullptr;
        }
    }